

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O3

die_object __thiscall
cpptrace::detail::libdwarf::die_object::resolve_reference_attribute
          (die_object *this,Dwarf_Half attr_num)

{
  Dwarf_Debug pDVar1;
  Dwarf_Attribute attr_00;
  int iVar2;
  Dwarf_Bool is_info_00;
  Dwarf_Half in_DX;
  Dwarf_Die extraout_RDX;
  undefined6 in_register_00000032;
  long *plVar3;
  string *in_R8;
  die_object dVar4;
  source_location location;
  Dwarf_Half form;
  Dwarf_Off global_offset;
  Dwarf_Attribute attr;
  Dwarf_Off off;
  Dwarf_Bool is_info;
  Dwarf_Die target;
  char *in_stack_ffffffffffffff68;
  Dwarf_Half local_8c;
  char local_8a [2];
  Dwarf_Die local_88;
  Dwarf_Attribute local_80;
  Dwarf_Error local_78;
  size_type local_70;
  undefined1 local_68 [16];
  string local_58;
  Dwarf_Bool local_34;
  Dwarf_Die local_30;
  Dwarf_Attribute local_28;
  undefined1 local_1f;
  
  plVar3 = (long *)CONCAT62(in_register_00000032,attr_num);
  iVar2 = dwarf_attr((Dwarf_Die)plVar3[1],in_DX,&local_80,(Dwarf_Error *)0x0);
  attr_00 = local_80;
  if (iVar2 != 0) {
    assert_fail((detail *)0x1,0x19073b,
                "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                ,(source_location)ZEXT816(0xc9),in_stack_ffffffffffffff68);
  }
  local_28 = local_80;
  local_1f = 1;
  local_8c = 0;
  local_78 = (Dwarf_Error)0x0;
  iVar2 = dwarf_whatform(local_80,&local_8c,&local_78);
  if (iVar2 == 1) {
    handle_dwarf_error((Dwarf_Debug)*plVar3,local_78);
  }
  if (iVar2 != 0) {
    assert_fail((detail *)0x1,0x18f79f,
                "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                ,(source_location)ZEXT816(0xcc),in_stack_ffffffffffffff68);
  }
  if (local_8c - 0x11 < 5) {
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_34 = dwarf_get_die_infotypes_flag((Dwarf_Die)plVar3[1]);
    local_78 = (Dwarf_Error)0x0;
    iVar2 = dwarf_formref(local_80,(Dwarf_Off *)&local_58,&local_34,&local_78);
    if (iVar2 == 1) {
      handle_dwarf_error((Dwarf_Debug)*plVar3,local_78);
    }
    if (iVar2 != 0) {
      assert_fail((detail *)0x1,0x1907d3,
                  "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,(source_location)ZEXT816(0xd6),in_stack_ffffffffffffff68);
    }
    local_88 = (Dwarf_Die)0x0;
    local_78 = (Dwarf_Error)0x0;
    iVar2 = dwarf_convert_to_global_offset
                      (local_80,(Dwarf_Off)local_58._M_dataplus._M_p,(Dwarf_Off *)&local_88,
                       &local_78);
    if (iVar2 == 1) {
      handle_dwarf_error((Dwarf_Debug)*plVar3,local_78);
    }
    if (iVar2 != 0) {
      assert_fail((detail *)0x1,0x19080a,
                  "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,(source_location)ZEXT816(0xd8),in_stack_ffffffffffffff68);
    }
    local_30 = (Dwarf_Die)0x0;
    local_78 = (Dwarf_Error)0x0;
    iVar2 = dwarf_offdie_b((Dwarf_Debug)*plVar3,(Dwarf_Off)local_88,local_34,&local_30,&local_78);
    if (iVar2 == 1) {
      handle_dwarf_error((Dwarf_Debug)*plVar3,local_78);
    }
    if (iVar2 != 0) {
      assert_fail((detail *)0x1,0x190857,
                  "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,(source_location)ZEXT816(0xda),in_stack_ffffffffffffff68);
    }
    pDVar1 = (Dwarf_Debug)*plVar3;
    this->dbg = pDVar1;
    this->die = local_30;
    if (pDVar1 == (Dwarf_Debug)0x0) {
      assert_fail((detail *)0x0,0x18f4ca,
                  "cpptrace::detail::libdwarf::die_object::die_object(Dwarf_Debug, Dwarf_Die)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,(source_location)ZEXT816(0x42),in_stack_ffffffffffffff68);
    }
  }
  else if (local_8c == 0x10) {
    local_78 = (Dwarf_Error)0x0;
    iVar2 = dwarf_global_formref(local_80,(Dwarf_Off *)&local_58,&local_78);
    if (iVar2 == 1) {
      handle_dwarf_error((Dwarf_Debug)*plVar3,local_78);
    }
    if (iVar2 != 0) {
      assert_fail((detail *)0x1,0x18f960,
                  "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,(source_location)ZEXT816(0xe0),in_stack_ffffffffffffff68);
    }
    is_info_00 = dwarf_get_die_infotypes_flag((Dwarf_Die)plVar3[1]);
    local_88 = (Dwarf_Die)0x0;
    local_78 = (Dwarf_Error)0x0;
    iVar2 = dwarf_offdie_b((Dwarf_Debug)*plVar3,(Dwarf_Off)local_58._M_dataplus._M_p,is_info_00,
                           &local_88,&local_78);
    if (iVar2 == 1) {
      handle_dwarf_error((Dwarf_Debug)*plVar3,local_78);
    }
    if (iVar2 != 0) {
      assert_fail((detail *)0x1,0x19089f,
                  "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,(source_location)ZEXT816(0xe3),in_stack_ffffffffffffff68);
    }
    pDVar1 = (Dwarf_Debug)*plVar3;
    this->dbg = pDVar1;
    this->die = local_88;
    if (pDVar1 == (Dwarf_Debug)0x0) {
      assert_fail((detail *)0x0,0x18f4ca,
                  "cpptrace::detail::libdwarf::die_object::die_object(Dwarf_Debug, Dwarf_Die)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,(source_location)ZEXT816(0x42),in_stack_ffffffffffffff68);
    }
  }
  else {
    if (local_8c != 0x20) {
      microfmt::format<unsigned_short&,unsigned_short&>
                (&local_58,(microfmt *)"unknown form for attribute {} {}\n",local_8a,&local_8c,
                 (unsigned_short *)in_R8);
      local_78 = (Dwarf_Error)local_68;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        local_68._8_8_ = local_58.field_2._8_8_;
      }
      else {
        local_78 = (Dwarf_Error)local_58._M_dataplus._M_p;
      }
      local_70 = local_58._M_string_length;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      location._8_8_ = &local_78;
      location.file = (char *)0xf0;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      panic((detail *)
            "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
            ,location,in_R8);
    }
    local_78 = (Dwarf_Error)0x0;
    iVar2 = dwarf_formsig8(local_80,(Dwarf_Sig8 *)&local_58,&local_78);
    if (iVar2 == 1) {
      handle_dwarf_error((Dwarf_Debug)*plVar3,local_78);
    }
    if (iVar2 != 0) {
      assert_fail((detail *)0x1,0x1908dd,
                  "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,(source_location)ZEXT816(0xe9),in_stack_ffffffffffffff68);
    }
    local_88 = (Dwarf_Die)0x0;
    local_30 = (Dwarf_Die)((ulong)local_30 & 0xffffffff00000000);
    local_78 = (Dwarf_Error)0x0;
    iVar2 = dwarf_find_die_given_sig8
                      ((Dwarf_Debug)*plVar3,(Dwarf_Sig8 *)&local_58,&local_88,
                       (Dwarf_Bool *)&local_30,&local_78);
    if (iVar2 == 1) {
      handle_dwarf_error((Dwarf_Debug)*plVar3,local_78);
    }
    if (iVar2 != 0) {
      assert_fail((detail *)0x1,0x190911,
                  "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,(source_location)ZEXT816(0xec),in_stack_ffffffffffffff68);
    }
    pDVar1 = (Dwarf_Debug)*plVar3;
    this->dbg = pDVar1;
    this->die = local_88;
    if (pDVar1 == (Dwarf_Debug)0x0) {
      assert_fail((detail *)0x0,0x18f4ca,
                  "cpptrace::detail::libdwarf::die_object::die_object(Dwarf_Debug, Dwarf_Die)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,(source_location)ZEXT816(0x42),in_stack_ffffffffffffff68);
    }
  }
  dwarf_dealloc_attribute(attr_00);
  dVar4.die = extraout_RDX;
  dVar4.dbg = (Dwarf_Debug)this;
  return dVar4;
}

Assistant:

die_object resolve_reference_attribute(Dwarf_Half attr_num) const {
            Dwarf_Attribute attr;
            VERIFY(dwarf_attr(die, attr_num, &attr, nullptr) == DW_DLV_OK);
            auto wrapper = raii_wrap(attr, [] (Dwarf_Attribute attr) { dwarf_dealloc_attribute(attr); });
            Dwarf_Half form = 0;
            VERIFY(wrap(dwarf_whatform, attr, &form) == DW_DLV_OK);
            switch(form) {
                case DW_FORM_ref1:
                case DW_FORM_ref2:
                case DW_FORM_ref4:
                case DW_FORM_ref8:
                case DW_FORM_ref_udata:
                    {
                        Dwarf_Off off = 0;
                        Dwarf_Bool is_info = dwarf_get_die_infotypes_flag(die);
                        VERIFY(wrap(dwarf_formref, attr, &off, &is_info) == DW_DLV_OK);
                        Dwarf_Off global_offset = 0;
                        VERIFY(wrap(dwarf_convert_to_global_offset, attr, off, &global_offset) == DW_DLV_OK);
                        Dwarf_Die target = nullptr;
                        VERIFY(wrap(dwarf_offdie_b, dbg, global_offset, is_info, &target) == DW_DLV_OK);
                        return die_object(dbg, target);
                    }
                case DW_FORM_ref_addr:
                    {
                        Dwarf_Off off;
                        VERIFY(wrap(dwarf_global_formref, attr, &off) == DW_DLV_OK);
                        int is_info = dwarf_get_die_infotypes_flag(die);
                        Dwarf_Die target = nullptr;
                        VERIFY(wrap(dwarf_offdie_b, dbg, off, is_info, &target) == DW_DLV_OK);
                        return die_object(dbg, target);
                    }
                case DW_FORM_ref_sig8:
                    {
                        Dwarf_Sig8 signature;
                        VERIFY(wrap(dwarf_formsig8, attr, &signature) == DW_DLV_OK);
                        Dwarf_Die target = nullptr;
                        Dwarf_Bool targ_is_info = false;
                        VERIFY(wrap(dwarf_find_die_given_sig8, dbg, &signature, &target, &targ_is_info) == DW_DLV_OK);
                        return die_object(dbg, target);
                    }
                default:
                    PANIC(microfmt::format("unknown form for attribute {} {}\n", attr_num, form));
            }
        }